

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test
::TestBody(CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test *this)

{
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = 0xd0;
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = '@';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = ' ';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0xa0;
  CpuAbsoluteIndexedTest::run_readwrite_instruction_without_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,'{',Y,'P');
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, rra_carry_but_no_overflow_without_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x20;
    memory_content = 0xA0;

    run_readwrite_instruction_without_pagecrossing(RRA_ABSY, IndexReg::Y, 0x50);
}